

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

void __thiscall cmGetPropertyCommand::cmGetPropertyCommand(cmGetPropertyCommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmGetPropertyCommand_005b8720;
  (this->Variable)._M_dataplus._M_p = (pointer)&(this->Variable).field_2;
  (this->Variable)._M_string_length = 0;
  (this->Variable).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->PropertyName)._M_dataplus._M_p = (pointer)&(this->PropertyName).field_2;
  (this->PropertyName)._M_string_length = 0;
  (this->PropertyName).field_2._M_local_buf[0] = '\0';
  this->InfoType = OutValue;
  return;
}

Assistant:

cmGetPropertyCommand::cmGetPropertyCommand()
{
  this->InfoType = OutValue;
}